

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall minja::ElifTemplateToken::~ElifTemplateToken(ElifTemplateToken *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__ElifTemplateToken_0042fff8;
  std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x3200da);
  TemplateToken::~TemplateToken((TemplateToken *)0x3200e4);
  return;
}

Assistant:

ElifTemplateToken(const Location & loc, SpaceHandling pre, SpaceHandling post, std::shared_ptr<Expression> && c) : TemplateToken(Type::Elif, loc, pre, post), condition(std::move(c)) {}